

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O0

Logs * __thiscall
deqp::gles2::Performance::InvalidShaderCompilerCase::getLogs
          (Logs *__return_storage_ptr__,InvalidShaderCompilerCase *this,Shaders *shaders)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  deUint32 in_ECX;
  string local_80;
  string local_50;
  undefined1 local_29;
  Performance *local_28;
  Functions *gl;
  Shaders *shaders_local;
  InvalidShaderCompilerCase *this_local;
  Logs *result;
  
  gl = (Functions *)shaders;
  shaders_local = (Shaders *)this;
  this_local = (InvalidShaderCompilerCase *)__return_storage_ptr__;
  pRVar2 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  local_28 = (Performance *)CONCAT44(extraout_var,iVar1);
  local_29 = 0;
  Logs::Logs(__return_storage_ptr__);
  getShaderInfoLog_abi_cxx11_
            (&local_50,local_28,(Functions *)(ulong)*(uint *)&gl->activeShaderProgram,in_ECX);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  getShaderInfoLog_abi_cxx11_
            (&local_80,local_28,(Functions *)(ulong)*(uint *)((long)&gl->activeShaderProgram + 4),
             in_ECX);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->frag,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  return __return_storage_ptr__;
}

Assistant:

InvalidShaderCompilerCase::Logs InvalidShaderCompilerCase::getLogs (const Shaders& shaders) const
{
	const glw::Functions&	gl = m_context.getRenderContext().getFunctions();
	Logs					result;

	result.vert = getShaderInfoLog(gl, shaders.vertShader);
	result.frag = getShaderInfoLog(gl, shaders.fragShader);

	return result;
}